

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O2

double __thiscall Vertex::getReactivePower(Vertex *this)

{
  pointer pCVar1;
  uint uVar2;
  double dVar3;
  
  dVar3 = (this->loadFactors).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
          super__Vector_impl_data._M_start[idLF].level * this->reactivePower;
  pCVar1 = (this->capacitorsAlloc).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>._M_impl
           .super__Vector_impl_data._M_start;
  for (uVar2 = 0;
      (ulong)uVar2 <
      (ulong)(((long)(this->capacitorsAlloc).
                     super__Vector_base<Capacitor,_std::allocator<Capacitor>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1) / 0x28); uVar2 = uVar2 + 1) {
    dVar3 = dVar3 - **(double **)
                      &pCVar1[uVar2].powerSteps.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl;
  }
  return dVar3;
}

Assistant:

double Vertex::getReactivePower(){
    double reactPower = this->loadFactors[ idLF ].level * this->reactivePower;
    for( unsigned int i = 0; i < capacitorsAlloc.size(); i++ ) {
        reactPower -= capacitorsAlloc[i].getPower();
    }
    return reactPower;
}